

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JustInTime.hpp
# Opt level: O0

void __thiscall
JustInTimeActor<Motorola::MFP68901::MFP68901,_HalfCycles,_819200,_2673749>::JustInTimeActor<>
          (JustInTimeActor<Motorola::MFP68901::MFP68901,_HalfCycles,_819200,_2673749> *this)

{
  JustInTimeActor<Motorola::MFP68901::MFP68901,_HalfCycles,_819200,_2673749> *this_local;
  
  ClockingHint::Observer::Observer(&this->super_Observer);
  (this->super_Observer)._vptr_Observer = (_func_int **)&PTR_set_component_prefers_clocking_00c9dbc0
  ;
  memset(&this->object_,0,0x98);
  Motorola::MFP68901::MFP68901::MFP68901(&this->object_);
  HalfCycles::HalfCycles(&this->time_since_update_);
  HalfCycles::HalfCycles(&this->time_until_event_);
  HalfCycles::HalfCycles(&this->time_overrun_);
  this->is_flushed_ = true;
  this->did_flush_ = false;
  this->clocking_preference_ = JustInTime;
  memset(&this->flush_concurrency_check_,0,1);
  ClockingHint::Source::set_clocking_hint_observer
            (&(this->object_).super_Source,&this->super_Observer);
  return;
}

Assistant:

JustInTimeActor(Args&&... args) : object_(std::forward<Args>(args)...) {
			if constexpr (std::is_base_of<ClockingHint::Source, T>::value) {
				object_.set_clocking_hint_observer(this);
			}
		}